

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argument_factory.hpp
# Opt level: O2

bool __thiscall
boost::runtime::value_interpreter<bool,_false>::interpret
          (value_interpreter<bool,_false> *this,cstring *param_name,cstring *source)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  cstring local_1d8;
  basic_cstring<const_char> local_1c8;
  cstring local_1b8;
  basic_cstring<const_char> local_1a8;
  cstring local_198;
  basic_cstring<const_char> local_188;
  cstring local_178;
  basic_cstring<const_char> local_168;
  cstring local_158;
  basic_cstring<const_char> local_148;
  cstring local_138;
  basic_cstring<const_char> local_128;
  cstring local_118;
  basic_cstring<const_char> local_108;
  cstring local_f8;
  basic_cstring<const_char> local_e0;
  self_type local_d0;
  undefined **local_c0;
  iterator local_b8;
  iterator pvStack_b0;
  undefined1 *local_a8;
  undefined8 local_a0;
  undefined1 local_98 [16];
  specific_param_error<boost::runtime::format_error,_boost::runtime::input_error> local_88;
  format_error local_50;
  
  if (value_interpreter<bool,false>::
      interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
      ::s_YES == '\0') {
    iVar3 = __cxa_guard_acquire(&value_interpreter<bool,false>::
                                 interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
                                 ::s_YES);
    if (iVar3 != 0) {
      unit_test::basic_cstring<const_char>::basic_cstring(&interpret::s_YES,"YES");
      __cxa_guard_release(&value_interpreter<bool,false>::
                           interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
                           ::s_YES);
    }
  }
  if (value_interpreter<bool,false>::
      interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
      ::s_Y == '\0') {
    iVar3 = __cxa_guard_acquire(&value_interpreter<bool,false>::
                                 interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
                                 ::s_Y);
    if (iVar3 != 0) {
      unit_test::basic_cstring<const_char>::basic_cstring(&interpret::s_Y,"Y");
      __cxa_guard_release(&value_interpreter<bool,false>::
                           interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
                           ::s_Y);
    }
  }
  if (value_interpreter<bool,false>::
      interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
      ::s_NO == '\0') {
    iVar3 = __cxa_guard_acquire(&value_interpreter<bool,false>::
                                 interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
                                 ::s_NO);
    if (iVar3 != 0) {
      unit_test::basic_cstring<const_char>::basic_cstring(&interpret::s_NO,"NO");
      __cxa_guard_release(&value_interpreter<bool,false>::
                           interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
                           ::s_NO);
    }
  }
  if (value_interpreter<bool,false>::
      interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
      ::s_N == '\0') {
    iVar3 = __cxa_guard_acquire(&value_interpreter<bool,false>::
                                 interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
                                 ::s_N);
    if (iVar3 != 0) {
      unit_test::basic_cstring<const_char>::basic_cstring(&interpret::s_N,"N");
      __cxa_guard_release(&value_interpreter<bool,false>::
                           interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
                           ::s_N);
    }
  }
  if (value_interpreter<bool,false>::
      interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
      ::s_TRUE == '\0') {
    iVar3 = __cxa_guard_acquire(&value_interpreter<bool,false>::
                                 interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
                                 ::s_TRUE);
    if (iVar3 != 0) {
      unit_test::basic_cstring<const_char>::basic_cstring(&interpret::s_TRUE,"TRUE");
      __cxa_guard_release(&value_interpreter<bool,false>::
                           interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
                           ::s_TRUE);
    }
  }
  if (value_interpreter<bool,false>::
      interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
      ::s_FALSE == '\0') {
    iVar3 = __cxa_guard_acquire(&value_interpreter<bool,false>::
                                 interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
                                 ::s_FALSE);
    if (iVar3 != 0) {
      unit_test::basic_cstring<const_char>::basic_cstring(&interpret::s_FALSE,"FALSE");
      __cxa_guard_release(&value_interpreter<bool,false>::
                           interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
                           ::s_FALSE);
    }
  }
  if (value_interpreter<bool,false>::
      interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
      ::s_one == '\0') {
    iVar3 = __cxa_guard_acquire(&value_interpreter<bool,false>::
                                 interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
                                 ::s_one);
    if (iVar3 != 0) {
      unit_test::basic_cstring<const_char>::basic_cstring(&interpret::s_one,"1");
      __cxa_guard_release(&value_interpreter<bool,false>::
                           interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
                           ::s_one);
    }
  }
  if (value_interpreter<bool,false>::
      interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
      ::s_zero == '\0') {
    iVar3 = __cxa_guard_acquire(&value_interpreter<bool,false>::
                                 interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
                                 ::s_zero);
    if (iVar3 != 0) {
      unit_test::basic_cstring<const_char>::basic_cstring(&interpret::s_zero,"0");
      __cxa_guard_release(&value_interpreter<bool,false>::
                           interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
                           ::s_zero);
    }
  }
  local_d0.m_begin = "";
  local_d0.m_end = "";
  unit_test::basic_cstring<const_char>::trim(source,&local_d0);
  local_e0.m_begin = source->m_begin;
  local_e0.m_end = source->m_end;
  bVar2 = true;
  if (local_e0.m_end != local_e0.m_begin) {
    local_f8 = interpret::s_YES;
    bVar1 = unit_test::case_ins_eq<char_const>(&local_e0,&local_f8);
    if (!bVar1) {
      local_108.m_begin = source->m_begin;
      local_108.m_end = source->m_end;
      local_118 = interpret::s_Y;
      bVar1 = unit_test::case_ins_eq<char_const>(&local_108,&local_118);
      if (!bVar1) {
        local_128.m_begin = source->m_begin;
        local_128.m_end = source->m_end;
        local_138 = interpret::s_one;
        bVar1 = unit_test::case_ins_eq<char_const>(&local_128,&local_138);
        if (!bVar1) {
          local_148.m_begin = source->m_begin;
          local_148.m_end = source->m_end;
          local_158 = interpret::s_TRUE;
          bVar1 = unit_test::case_ins_eq<char_const>(&local_148,&local_158);
          if (!bVar1) {
            local_168.m_begin = source->m_begin;
            local_168.m_end = source->m_end;
            local_178 = interpret::s_NO;
            bVar2 = unit_test::case_ins_eq<char_const>(&local_168,&local_178);
            if (!bVar2) {
              local_188.m_begin = source->m_begin;
              local_188.m_end = source->m_end;
              local_198 = interpret::s_N;
              bVar2 = unit_test::case_ins_eq<char_const>(&local_188,&local_198);
              if (!bVar2) {
                local_1a8.m_begin = source->m_begin;
                local_1a8.m_end = source->m_end;
                local_1b8 = interpret::s_zero;
                bVar2 = unit_test::case_ins_eq<char_const>(&local_1a8,&local_1b8);
                if (!bVar2) {
                  local_1c8.m_begin = source->m_begin;
                  local_1c8.m_end = source->m_end;
                  local_1d8 = interpret::s_FALSE;
                  bVar2 = unit_test::case_ins_eq<char_const>(&local_1c8,&local_1d8);
                  if (!bVar2) {
                    local_b8 = param_name->m_begin;
                    pvStack_b0 = param_name->m_end;
                    local_a8 = local_98;
                    local_a0 = 0;
                    local_98[0] = 0;
                    local_c0 = &PTR__param_error_001e0f90;
                    specific_param_error<boost::runtime::format_error,boost::runtime::input_error>::
                    operator<<((format_error *)&local_88,
                               (specific_param_error<boost::runtime::format_error,boost::runtime::input_error>
                                *)&local_c0,source);
                    specific_param_error<boost::runtime::format_error,_boost::runtime::input_error>
                    ::operator<<(&local_50,&local_88," can\'t be interpreted as bool value.");
                    unit_test::ut_detail::throw_exception<boost::runtime::format_error>(&local_50);
                  }
                }
              }
            }
            bVar2 = false;
          }
        }
      }
    }
  }
  return bVar2;
}

Assistant:

bool    interpret( cstring param_name, cstring source ) const
    {
        static cstring const s_YES( "YES" );
        static cstring const s_Y( "Y" );
        static cstring const s_NO( "NO" );
        static cstring const s_N( "N" );
        static cstring const s_TRUE( "TRUE" );
        static cstring const s_FALSE( "FALSE" );
        static cstring const s_one( "1" );
        static cstring const s_zero( "0" );

        source.trim();

        if( source.is_empty() ||
            case_ins_eq( source, s_YES ) ||
            case_ins_eq( source, s_Y ) ||
            case_ins_eq( source, s_one ) ||
            case_ins_eq( source, s_TRUE ) )
            return true;

        if( case_ins_eq( source, s_NO ) ||
            case_ins_eq( source, s_N ) ||
            case_ins_eq( source, s_zero ) ||
            case_ins_eq( source, s_FALSE ) )
            return false;

        BOOST_TEST_I_THROW( format_error( param_name ) << source << " can't be interpreted as bool value." );
    }